

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall
kj::ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question>::~ArrayBuilder
          (ArrayBuilder<capnp::_::RpcSystemBase::RpcConnectionState::Question> *this)

{
  Question *pQVar1;
  RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *pRVar2;
  Question *pQVar3;
  
  pQVar1 = this->ptr;
  if (pQVar1 != (Question *)0x0) {
    pRVar2 = this->pos;
    pQVar3 = this->endPtr;
    this->ptr = (Question *)0x0;
    this->pos = (RemoveConst<capnp::_::RpcSystemBase::RpcConnectionState::Question> *)0x0;
    this->endPtr = (Question *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pQVar1,0x28,((long)pRVar2 - (long)pQVar1 >> 3) * -0x3333333333333333,
               ((long)pQVar3 - (long)pQVar1 >> 3) * -0x3333333333333333,
               ArrayDisposer::Dispose_<capnp::_::RpcSystemBase::RpcConnectionState::Question>::
               destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }